

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssertionExpr.cpp
# Opt level: O1

AssertionExpr *
slang::ast::ClockingAssertionExpr::fromSyntax
          (ClockingSequenceExprSyntax *syntax,ASTContext *context)

{
  Compilation *this;
  TimingControlSyntax *pTVar1;
  int iVar2;
  int iVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  ClockingAssertionExpr *pCVar4;
  socklen_t __len;
  ASTContext local_60;
  
  this = ((context->scope).ptr)->compilation;
  pTVar1 = (syntax->event).ptr;
  ASTContext::resetFlags(&local_60,context,(bitmask<slang::ast::ASTFlags>)0x20);
  iVar2 = TimingControl::bind((int)pTVar1,(sockaddr *)&local_60,__len);
  iVar3 = AssertionExpr::bind((int)(syntax->expr).ptr,(sockaddr *)context,0);
  checkForClockingBlock(context,&((syntax->event).ptr)->super_SyntaxNode);
  pCVar4 = BumpAllocator::
           emplace<slang::ast::ClockingAssertionExpr,slang::ast::TimingControl&,slang::ast::AssertionExpr_const&>
                     (&this->super_BumpAllocator,(TimingControl *)CONCAT44(extraout_var,iVar2),
                      (AssertionExpr *)CONCAT44(extraout_var_00,iVar3));
  return &pCVar4->super_AssertionExpr;
}

Assistant:

AssertionExpr& ClockingAssertionExpr::fromSyntax(const ClockingSequenceExprSyntax& syntax,
                                                 const ASTContext& context) {
    auto& comp = context.getCompilation();
    auto& clocking = TimingControl::bind(*syntax.event,
                                         context.resetFlags(ASTFlags::NonProcedural));
    auto& expr = bind(*syntax.expr, context);

    checkForClockingBlock(context, *syntax.event);

    return *comp.emplace<ClockingAssertionExpr>(clocking, expr);
}